

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_ClassArray<ON_HatchLine> * __thiscall
ON_ClassArray<ON_HatchLine>::operator=
          (ON_ClassArray<ON_HatchLine> *this,ON_ClassArray<ON_HatchLine> *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  ON_HatchLine *pOVar4;
  ON_HatchLine *pOVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  
  if (this != src) {
    iVar3 = src->m_count;
    if ((long)iVar3 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar3) {
        SetCapacity(this,(long)iVar3);
      }
      if ((this->m_a != (ON_HatchLine *)0x0) &&
         (iVar3 = src->m_count, this->m_count = iVar3, 0 < iVar3)) {
        lVar10 = 0x28;
        lVar9 = 0;
        do {
          pOVar4 = src->m_a;
          pOVar5 = this->m_a;
          *(undefined8 *)((long)pOVar5 + lVar10 + -8) = *(undefined8 *)((long)pOVar4 + lVar10 + -8);
          puVar1 = (undefined8 *)((long)pOVar4 + lVar10 + -0x28);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)pOVar4 + lVar10 + -0x18);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pOVar5 + lVar10 + -0x18);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)pOVar5 + lVar10 + -0x28);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          ON_SimpleArray<double>::operator=
                    ((ON_SimpleArray<double> *)((long)&pOVar5->m_angle_radians + lVar10),
                     (ON_SimpleArray<double> *)((long)&pOVar4->m_angle_radians + lVar10));
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x40;
        } while (lVar9 < this->m_count);
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}